

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_3ee93c::ArgParser::argEncBits(ArgParser *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  string local_38;
  
  if ((this->accumulated_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->accumulated_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"positional and dashed encryption arguments may not be mixed","")
    ;
    QPDFArgParser::usage(&this->ap,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)arg);
  if (iVar4 == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"40-bit encryption","");
    QPDFArgParser::selectOptionTable(&this->ap,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    iVar4 = 0x28;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)arg);
    if (iVar4 == 0) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"128-bit encryption","");
      QPDFArgParser::selectOptionTable(&this->ap,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      iVar4 = 0x80;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)arg);
      paVar1 = &local_38.field_2;
      local_38._M_dataplus._M_p = (pointer)paVar1;
      if (iVar4 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"256-bit encryption","")
        ;
        QPDFArgParser::selectOptionTable(&this->ap,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != paVar1) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        iVar4 = 0x100;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"encryption key length must be 40, 128, or 256","");
        QPDFArgParser::usage(&this->ap,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != paVar1) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        iVar4 = 0;
      }
    }
  }
  QPDFJob::Config::encrypt
            ((Config *)&local_38,
             (char *)(this->c_main).super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,iVar4);
  sVar3 = local_38._M_string_length;
  _Var2._M_p = local_38._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)0x0;
  local_38._M_string_length = 0;
  this_00 = (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var2._M_p;
  (this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length);
  }
  return;
}

Assistant:

void
ArgParser::argEncBits(std::string const& arg)
{
    if (!accumulated_args.empty()) {
        usage("positional and dashed encryption arguments may not be mixed");
    }
    int keylen = 0;
    if (arg == "40") {
        keylen = 40;
        this->ap.selectOptionTable(O_40_BIT_ENCRYPTION);
    } else if (arg == "128") {
        keylen = 128;
        this->ap.selectOptionTable(O_128_BIT_ENCRYPTION);
    } else if (arg == "256") {
        keylen = 256;
        this->ap.selectOptionTable(O_256_BIT_ENCRYPTION);
    } else {
        usage("encryption key length must be 40, 128, or 256");
    }
    this->c_enc = c_main->encrypt(keylen, user_password, owner_password);
}